

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall ON_SubDMeshFragment::Clear(ON_SubDMeshFragment *this)

{
  ON_SubDMeshFragment *this_local;
  
  this->m_face = (ON_SubDFace *)0x0;
  this->m_face_vertex_index[0] = 0;
  this->m_face_vertex_index[1] = 0;
  this->m_face_vertex_index[2] = 0;
  this->m_face_vertex_index[3] = 0;
  this->m_face_fragment_count = 0;
  this->m_face_fragment_index = 0;
  this->m_vertex_count_etc = this->m_vertex_count_etc & 0xe000;
  ClearTextureCoordinates(this);
  ClearCurvatures(this);
  ClearColors(this);
  ClearControlNetQuad(this);
  ClearPackRect(this);
  memcpy(&this->m_grid,&ON_SubDMeshFragmentGrid::Empty,0x30);
  memcpy(&this->m_surface_bbox,&ON_BoundingBox::NanBoundingBox,0x30);
  return;
}

Assistant:

void ON_SubDMeshFragment::Clear() ON_NOEXCEPT
{
  m_face = nullptr;
  m_face_vertex_index[0] = 0;
  m_face_vertex_index[1] = 0;
  m_face_vertex_index[2] = 0;
  m_face_vertex_index[3] = 0;

  m_face_fragment_count = 0;
  m_face_fragment_index = 0;

  // This line sets vertex count = 0
  m_vertex_count_etc &= ON_SubDMeshFragment::EtcMask;

  // Do NOT change vertex capacity.
  // Do NOT delete managed arrays.
  // The point is to be able to clear and reuse a fragment.

  ClearTextureCoordinates();
  ClearCurvatures();
  ClearColors();
  ClearControlNetQuad();
  ClearPackRect();
  m_grid = ON_SubDMeshFragmentGrid::Empty;
  m_surface_bbox = ON_BoundingBox::NanBoundingBox;
}